

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Service_Request_PDU.cpp
# Opt level: O1

void __thiscall
KDIS::PDU::Service_Request_PDU::Decode
          (Service_Request_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  KUINT8 *V;
  KUINT16 KVar1;
  KException *pKVar2;
  int iVar3;
  undefined7 in_register_00000011;
  ushort uVar4;
  Supplies sup;
  undefined1 local_48 [32];
  
  KVar1 = KDataStream::GetBufferSize(stream);
  iVar3 = 0xc;
  if ((int)CONCAT71(in_register_00000011,ignoreHeader) == 0) {
    iVar3 = 0;
  }
  if (0x1b < iVar3 + (uint)KVar1) {
    Logistics_Header::Decode((Logistics_Header *)this,stream,ignoreHeader);
    KDataStream::Read(stream,&this->m_ui8ServiceTypeRequested);
    V = &(this->super_Resupply_Received_PDU).m_ui8NumSupplyTypes;
    KDataStream::Read(stream,V);
    KDataStream::Read<unsigned_short>(stream,&(this->super_Resupply_Received_PDU).m_ui16Padding1);
    KVar1 = KDataStream::GetBufferSize(stream);
    if ((ushort)((ushort)(this->super_Resupply_Received_PDU).m_ui8NumSupplyTypes * 0xc) <= KVar1) {
      if (*V != '\0') {
        uVar4 = 0;
        do {
          DATA_TYPE::Supplies::Supplies((Supplies *)local_48);
          (**(_func_int **)(local_48._0_8_ + 0x18))(local_48,stream);
          std::vector<KDIS::DATA_TYPE::Supplies,_std::allocator<KDIS::DATA_TYPE::Supplies>_>::
          push_back(&(this->super_Resupply_Received_PDU).m_vSupplies,(value_type *)local_48);
          DATA_TYPE::Supplies::~Supplies((Supplies *)local_48);
          uVar4 = uVar4 + 1;
        } while (uVar4 < *V);
      }
      return;
    }
    pKVar2 = (KException *)__cxa_allocate_exception(0x30);
    local_48._0_8_ = local_48 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"Decode","");
    KException::KException(pKVar2,(KString *)local_48,0x1c);
    __cxa_throw(pKVar2,&KException::typeinfo,KException::~KException);
  }
  pKVar2 = (KException *)__cxa_allocate_exception(0x30);
  local_48._0_8_ = local_48 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"Decode","");
  KException::KException(pKVar2,(KString *)local_48,2);
  __cxa_throw(pKVar2,&KException::typeinfo,KException::~KException);
}

Assistant:

void Service_Request_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < SERVICE_REQUEST_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    Logistics_Header::Decode( stream, ignoreHeader );

    stream >> m_ui8ServiceTypeRequested
           >> m_ui8NumSupplyTypes
           >> m_ui16Padding1;

    // Now recheck the size of the packet as we now know the number of supply types.
    if( stream.GetBufferSize() < m_ui8NumSupplyTypes * Supplies::SUPPLIES_SIZE )throw KException( __FUNCTION__, RESUPPLY_RECEIVED_PDU_SIZE );

    for( KUINT16 i = 0; i < m_ui8NumSupplyTypes; ++i )
    {
        Supplies sup;
        stream >> KDIS_STREAM sup;
        m_vSupplies.push_back( sup );
    }
}